

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# as-02-info.cpp
# Opt level: O0

void __thiscall
MyACESPictureDescriptor::FillDescriptor(MyACESPictureDescriptor *this,MXFReader *Reader)

{
  bool bVar1;
  Dictionary *pDVar2;
  byte_t *pbVar3;
  RGBAEssenceDescriptor *pRVar4;
  unsigned_long_long *puVar5;
  long *plVar6;
  reference ppIVar7;
  char *pcVar8;
  ILogSink *pIVar9;
  reference ppIVar10;
  long local_2d0;
  value_type local_298;
  Result_t local_250 [104];
  char local_1e8 [8];
  char buf_1 [64];
  TargetFrameSubDescriptor *p_1;
  _List_node_base *local_198;
  Result_t local_190 [104];
  char local_128 [8];
  char buf [64];
  value_type local_e0;
  ACESPictureSubDescriptor *p;
  _Self local_d0;
  iterator i;
  undefined1 local_60 [8];
  list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
  object_list;
  UL local_38;
  MXFReader *local_18;
  MXFReader *Reader_local;
  MyACESPictureDescriptor *this_local;
  
  local_18 = Reader;
  Reader_local = (MXFReader *)this;
  pDVar2 = (Dictionary *)ASDCP::DefaultCompositeDict();
  pbVar3 = ASDCP::Dictionary::ul(pDVar2,MDD_RGBAEssenceDescriptor);
  ASDCP::UL::UL(&local_38,pbVar3);
  pRVar4 = get_descriptor_by_type<AS_02::ACES::MXFReader,ASDCP::MXF::RGBAEssenceDescriptor>
                     (Reader,&local_38);
  this->m_RGBADescriptor = pRVar4;
  ASDCP::UL::~UL(&local_38);
  if (this->m_RGBADescriptor == (RGBAEssenceDescriptor *)0x0) {
    pIVar9 = (ILogSink *)Kumu::DefaultLogSink();
    Kumu::ILogSink::Error(pIVar9,"Picture descriptor not found.\n");
  }
  else {
    (this->super_PictureDescriptor).SampleRate = *(Rational *)(this->m_RGBADescriptor + 0xf0);
    bVar1 = ASDCP::MXF::optional_property<unsigned_long_long>::empty
                      ((optional_property<unsigned_long_long> *)(this->m_RGBADescriptor + 0xf8));
    if (!bVar1) {
      puVar5 = ASDCP::MXF::optional_property::operator_cast_to_unsigned_long_long_
                         ((optional_property *)(this->m_RGBADescriptor + 0xf8));
      (this->super_PictureDescriptor).ContainerDuration = (ui32_t)*puVar5;
    }
  }
  std::__cxx11::
  list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>::list
            ((list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
              *)local_60);
  plVar6 = (long *)(**(code **)(*(long *)local_18 + 0x10))();
  pDVar2 = (Dictionary *)ASDCP::DefaultCompositeDict();
  pbVar3 = ASDCP::Dictionary::ul(pDVar2,MDD_ACESPictureSubDescriptor);
  (**(code **)(*plVar6 + 0xb0))(&i,plVar6,pbVar3,local_60);
  Kumu::Result_t::~Result_t((Result_t *)&i);
  local_d0._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>::
       begin((list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
              *)local_60);
  while( true ) {
    p = (ACESPictureSubDescriptor *)
        std::__cxx11::
        list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>::end
                  ((list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
                    *)local_60);
    bVar1 = std::operator!=(&local_d0,(_Self *)&p);
    if (!bVar1) break;
    ppIVar7 = std::_List_iterator<ASDCP::MXF::InterchangeObject_*>::operator*(&local_d0);
    if (*ppIVar7 == (InterchangeObject *)0x0) {
      local_298 = (value_type)0x0;
    }
    else {
      local_298 = (value_type)
                  __dynamic_cast(*ppIVar7,&ASDCP::MXF::InterchangeObject::typeinfo,
                                 &ASDCP::MXF::ACESPictureSubDescriptor::typeinfo,0);
    }
    local_e0 = local_298;
    if (local_298 == (value_type)0x0) {
      pIVar9 = (ILogSink *)Kumu::DefaultLogSink();
      ppIVar7 = std::_List_iterator<ASDCP::MXF::InterchangeObject_*>::operator*(&local_d0);
      pcVar8 = Kumu::UUID::EncodeHex((UUID *)(*ppIVar7 + 0x58),local_128,0x40);
      Kumu::ILogSink::Error(pIVar9,"ACESPictureSubDescriptor type error.\n",pcVar8);
    }
    else {
      std::__cxx11::
      list<ASDCP::MXF::ACESPictureSubDescriptor_*,_std::allocator<ASDCP::MXF::ACESPictureSubDescriptor_*>_>
      ::push_back(&this->m_ACESPictureSubDescriptorList,&local_e0);
    }
    std::_List_iterator<ASDCP::MXF::InterchangeObject_*>::operator++(&local_d0);
  }
  std::__cxx11::
  list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>::clear
            ((list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
              *)local_60);
  plVar6 = (long *)(**(code **)(*(long *)local_18 + 0x10))();
  pDVar2 = (Dictionary *)ASDCP::DefaultCompositeDict();
  pbVar3 = ASDCP::Dictionary::ul(pDVar2,MDD_TargetFrameSubDescriptor);
  (**(code **)(*plVar6 + 0xb0))(local_190,plVar6,pbVar3,local_60);
  Kumu::Result_t::~Result_t(local_190);
  local_198 = (_List_node_base *)
              std::__cxx11::
              list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
              ::begin((list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
                       *)local_60);
  local_d0._M_node = local_198;
  while( true ) {
    p_1 = (TargetFrameSubDescriptor *)
          std::__cxx11::
          list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>::
          end((list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
               *)local_60);
    bVar1 = std::operator!=(&local_d0,(_Self *)&p_1);
    if (!bVar1) break;
    ppIVar7 = std::_List_iterator<ASDCP::MXF::InterchangeObject_*>::operator*(&local_d0);
    if (*ppIVar7 == (InterchangeObject *)0x0) {
      local_2d0 = 0;
    }
    else {
      local_2d0 = __dynamic_cast(*ppIVar7,&ASDCP::MXF::InterchangeObject::typeinfo,
                                 &ASDCP::MXF::TargetFrameSubDescriptor::typeinfo,0);
    }
    buf_1[0x38] = (undefined1)local_2d0;
    buf_1[0x39] = local_2d0._1_1_;
    buf_1[0x3a] = local_2d0._2_1_;
    buf_1[0x3b] = local_2d0._3_1_;
    buf_1[0x3c] = local_2d0._4_1_;
    buf_1[0x3d] = local_2d0._5_1_;
    buf_1[0x3e] = local_2d0._6_1_;
    buf_1[0x3f] = local_2d0._7_1_;
    if (local_2d0 == 0) {
      pIVar9 = (ILogSink *)Kumu::DefaultLogSink();
      ppIVar7 = std::_List_iterator<ASDCP::MXF::InterchangeObject_*>::operator*(&local_d0);
      pcVar8 = Kumu::UUID::EncodeHex((UUID *)(*ppIVar7 + 0x58),local_1e8,0x40);
      Kumu::ILogSink::Error(pIVar9,"TargetFrameSubDescriptor type error.\n",pcVar8);
    }
    else {
      std::__cxx11::
      list<ASDCP::MXF::TargetFrameSubDescriptor_*,_std::allocator<ASDCP::MXF::TargetFrameSubDescriptor_*>_>
      ::push_back(&this->m_TargetFrameSubDescriptorList,(value_type *)(buf_1 + 0x38));
    }
    std::_List_iterator<ASDCP::MXF::InterchangeObject_*>::operator++(&local_d0);
  }
  std::__cxx11::
  list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>::clear
            ((list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
              *)local_60);
  plVar6 = (long *)(**(code **)(*(long *)local_18 + 0x10))();
  pDVar2 = (Dictionary *)ASDCP::DefaultCompositeDict();
  pbVar3 = ASDCP::Dictionary::ul(pDVar2,MDD_Track);
  (**(code **)(*plVar6 + 0xb0))(local_250,plVar6,pbVar3,local_60);
  Kumu::Result_t::~Result_t(local_250);
  bVar1 = std::__cxx11::
          list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>::
          empty((list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
                 *)local_60);
  if (bVar1) {
    pIVar9 = (ILogSink *)Kumu::DefaultLogSink();
    Kumu::ILogSink::Error(pIVar9,"MXF Metadata contains no Track Sets.\n");
  }
  ppIVar10 = std::__cxx11::
             list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
             ::front((list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
                      *)local_60);
  (this->super_PictureDescriptor).EditRate = *(Rational *)(*ppIVar10 + 0x108);
  std::__cxx11::
  list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>::~list
            ((list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
              *)local_60);
  return;
}

Assistant:

void FillDescriptor(AS_02::ACES::MXFReader& Reader)
  {
    m_RGBADescriptor = get_descriptor_by_type<AS_02::ACES::MXFReader, RGBAEssenceDescriptor>
      (Reader, DefaultCompositeDict().ul(MDD_RGBAEssenceDescriptor));

    if ( m_RGBADescriptor != 0 )
      {
    	SampleRate = m_RGBADescriptor->SampleRate;
        if ( ! m_RGBADescriptor->ContainerDuration.empty() )
          {
            ContainerDuration = m_RGBADescriptor->ContainerDuration;
          }
      }
    else
      {
	DefaultLogSink().Error("Picture descriptor not found.\n");
      }

    std::list<InterchangeObject*> object_list;
    Reader.OP1aHeader().GetMDObjectsByType(DefaultCompositeDict().ul(MDD_ACESPictureSubDescriptor), object_list);

    std::list<InterchangeObject*>::iterator i = object_list.begin();
    for ( ; i != object_list.end(); ++i )
      {
    	ACESPictureSubDescriptor *p = dynamic_cast<ACESPictureSubDescriptor*>(*i);

	if ( p )
	  {
		m_ACESPictureSubDescriptorList.push_back(p);
	  }
	else
	  {
	    char buf[64];
	    DefaultLogSink().Error("ACESPictureSubDescriptor type error.\n", (**i).InstanceUID.EncodeHex(buf, 64));
	  }
      }

    object_list.clear();

    Reader.OP1aHeader().GetMDObjectsByType(DefaultCompositeDict().ul(MDD_TargetFrameSubDescriptor), object_list);

    i = object_list.begin();
    for ( ; i != object_list.end(); ++i )
      {
    	TargetFrameSubDescriptor *p = dynamic_cast<TargetFrameSubDescriptor*>(*i);

	if ( p )
	  {
		m_TargetFrameSubDescriptorList.push_back(p);
	  }
	else
	  {
	    char buf[64];
	    DefaultLogSink().Error("TargetFrameSubDescriptor type error.\n", (**i).InstanceUID.EncodeHex(buf, 64));
	  }
      }

    object_list.clear();

    Reader.OP1aHeader().GetMDObjectsByType(DefaultCompositeDict().ul(MDD_Track), object_list);

    if ( object_list.empty() )
      {
	DefaultLogSink().Error("MXF Metadata contains no Track Sets.\n");
      }

    EditRate = ((Track*)object_list.front())->EditRate;
  }